

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

bool __thiscall google::protobuf::safe_strtob(protobuf *this,StringPiece str,bool *value)

{
  protobuf pVar1;
  bool bVar2;
  undefined1 uVar3;
  LogMessage *pLVar4;
  long lVar5;
  char *pcVar6;
  protobuf pVar7;
  protobuf pVar8;
  StringPiece s2;
  StringPiece s2_00;
  StringPiece s2_01;
  StringPiece s2_02;
  StringPiece s1;
  StringPiece s1_00;
  StringPiece s1_01;
  StringPiece s1_02;
  LogFinisher local_59;
  LogMessage local_58;
  
  s1.length_ = str.ptr_;
  if ((undefined1 *)str.length_ == (undefined1 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x52f);
    pLVar4 = internal::LogMessage::operator<<(&local_58,"CHECK failed: value != nullptr: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,"nullptr output boolean given.");
    internal::LogFinisher::operator=(&local_59,pLVar4);
    internal::LogMessage::~LogMessage(&local_58);
  }
  switch(s1.length_) {
  case (char *)0x1:
    pcVar6 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar6];
      pVar7 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar7 = pVar1;
      }
      pVar1 = *(protobuf *)(pcVar6 + 0x3eba05);
      pVar8 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar8 = pVar1;
      }
      if (pVar7 != pVar8) {
        if (s1.length_ == (char *)0x1) goto LAB_002c36d2;
        if (s1.length_ == (char *)0x5) goto switchD_002c35cf_caseD_5;
        if (s1.length_ != (char *)0x3) goto switchD_002c35cf_caseD_2;
        goto switchD_002c35cf_caseD_3;
      }
      pcVar6 = pcVar6 + 1;
    } while (s1.length_ != pcVar6);
    break;
  default:
switchD_002c35cf_caseD_2:
    s2.length_ = 1;
    s2.ptr_ = "f";
    s1.ptr_ = (char *)this;
    bVar2 = CaseEqual(s1,s2);
    if (((!bVar2) &&
        (s2_00.length_ = 2, s2_00.ptr_ = "no", s1_00.length_ = (stringpiece_ssize_type)s1.length_,
        s1_00.ptr_ = (char *)this, bVar2 = CaseEqual(s1_00,s2_00), !bVar2)) &&
       (s2_01.length_ = 1, s2_01.ptr_ = "n", s1_01.length_ = (stringpiece_ssize_type)s1.length_,
       s1_01.ptr_ = (char *)this, bVar2 = CaseEqual(s1_01,s2_01), !bVar2)) {
      s2_02.length_ = 1;
      s2_02.ptr_ = "0";
      s1_02.length_ = (stringpiece_ssize_type)s1.length_;
      s1_02.ptr_ = (char *)this;
      bVar2 = CaseEqual(s1_02,s2_02);
      uVar3 = 0;
      if (!bVar2) {
        return false;
      }
      goto LAB_002c37d8;
    }
    goto LAB_002c37d6;
  case (char *)0x3:
switchD_002c35cf_caseD_3:
    pcVar6 = (char *)0x0;
    while( true ) {
      pVar1 = this[(long)pcVar6];
      pVar7 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar7 = pVar1;
      }
      pVar1 = *(protobuf *)(pcVar6 + 0x593b58);
      pVar8 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar8 = pVar1;
      }
      if (pVar7 != pVar8) break;
      pcVar6 = pcVar6 + 1;
      if (s1.length_ == pcVar6) goto LAB_002c3714;
    }
    if (s1.length_ == (char *)0x5) goto switchD_002c35cf_caseD_5;
    if (s1.length_ != (char *)0x1) goto switchD_002c35cf_caseD_2;
LAB_002c36d2:
    pcVar6 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar6];
      pVar7 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar7 = pVar1;
      }
      pVar1 = *(protobuf *)(pcVar6 + 0x35b7f8);
      pVar8 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar8 = pVar1;
      }
      if (pVar7 != pVar8) {
        if (s1.length_ != (char *)0x1) {
          if (s1.length_ != (char *)0x5) goto switchD_002c35cf_caseD_2;
          goto switchD_002c35cf_caseD_5;
        }
        pVar1 = *this;
        pVar7 = (protobuf)((char)pVar1 + ' ');
        if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
          pVar7 = pVar1;
        }
        uVar3 = 1;
        if (pVar7 == (protobuf)0x31) goto LAB_002c37d8;
        goto switchD_002c35cf_caseD_2;
      }
      pcVar6 = pcVar6 + 1;
    } while (s1.length_ != pcVar6);
    break;
  case (char *)0x4:
    lVar5 = 0;
    do {
      pVar1 = this[lVar5];
      pVar7 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar7 = pVar1;
      }
      pVar1 = *(protobuf *)("true" + lVar5);
      pVar8 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar8 = pVar1;
      }
      if (pVar7 != pVar8) goto switchD_002c35cf_caseD_2;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    break;
  case (char *)0x5:
switchD_002c35cf_caseD_5:
    pcVar6 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar6];
      pVar7 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar7 = pVar1;
      }
      pVar1 = *(protobuf *)(pcVar6 + 0x337148);
      pVar8 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar8 = pVar1;
      }
      if (pVar7 != pVar8) goto switchD_002c35cf_caseD_2;
      pcVar6 = pcVar6 + 1;
    } while (s1.length_ != pcVar6);
LAB_002c37d6:
    uVar3 = 0;
    goto LAB_002c37d8;
  }
LAB_002c3714:
  uVar3 = 1;
LAB_002c37d8:
  *(undefined1 *)str.length_ = uVar3;
  return true;
}

Assistant:

bool safe_strtob(StringPiece str, bool* value) {
  GOOGLE_CHECK(value != nullptr) << "nullptr output boolean given.";
  if (CaseEqual(str, "true") || CaseEqual(str, "t") ||
      CaseEqual(str, "yes") || CaseEqual(str, "y") ||
      CaseEqual(str, "1")) {
    *value = true;
    return true;
  }
  if (CaseEqual(str, "false") || CaseEqual(str, "f") ||
      CaseEqual(str, "no") || CaseEqual(str, "n") ||
      CaseEqual(str, "0")) {
    *value = false;
    return true;
  }
  return false;
}